

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statistics.cpp
# Opt level: O0

void STAT_Read(PNGHandle *png)

{
  FILE *file;
  undefined1 local_318 [8];
  FPNGChunkArchive arc;
  DWORD chunkLen;
  PNGHandle *png_local;
  
  arc.Chunk._52_4_ = M_FindPNGChunk(png,0x74615473);
  if (arc.Chunk._52_4_ != 0) {
    file = FileReader::GetFile(png->File);
    FPNGChunkArchive::FPNGChunkArchive
              ((FPNGChunkArchive *)local_318,file,0x74615473,(ulong)(uint)arc.Chunk._52_4_);
    SerializeStatistics((FArchive *)local_318);
    FPNGChunkArchive::~FPNGChunkArchive((FPNGChunkArchive *)local_318);
  }
  return;
}

Assistant:

void STAT_Read(PNGHandle *png)
{
	DWORD chunkLen = (DWORD)M_FindPNGChunk (png, STAT_ID);
	if (chunkLen != 0)
	{
		FPNGChunkArchive arc (png->File->GetFile(), STAT_ID, chunkLen);
		SerializeStatistics(arc);
	}
}